

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STExchange.h
# Opt level: O0

optional<jbcoin::PublicKey> * __thiscall
jbcoin::get<jbcoin::PublicKey,jbcoin::STBlob>
          (optional<jbcoin::PublicKey> *__return_storage_ptr__,jbcoin *this,STObject *st,
          TypedField<jbcoin::STBlob> *f)

{
  int iVar1;
  STBase *pSVar2;
  STBlob *local_80;
  STBlob *u;
  SerializedTypeID id;
  STBase *b;
  TypedField<jbcoin::STBlob> *f_local;
  STObject *st_local;
  optional<jbcoin::PublicKey> *t;
  
  boost::optional<jbcoin::PublicKey>::optional(__return_storage_ptr__);
  pSVar2 = STObject::peekAtPField((STObject *)this,(SField *)st);
  if ((pSVar2 != (STBase *)0x0) && (iVar1 = (*pSVar2->_vptr_STBase[4])(), iVar1 != 0)) {
    if (pSVar2 == (STBase *)0x0) {
      local_80 = (STBlob *)0x0;
    }
    else {
      local_80 = (STBlob *)__dynamic_cast(pSVar2,&STBase::typeinfo,&STBlob::typeinfo,0);
    }
    if (local_80 == (STBlob *)0x0) {
      Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
    }
    STExchange<jbcoin::STBlob,_jbcoin::PublicKey>::get(__return_storage_ptr__,local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

boost::optional<T>
get (STObject const& st,
    TypedField<U> const& f)
{
    boost::optional<T> t;
    STBase const* const b =
        st.peekAtPField(f);
    if (! b)
        return t;
    auto const id = b->getSType();
    if (id == STI_NOTPRESENT)
        return t;
    auto const u =
        dynamic_cast<U const*>(b);
    // This should never happen
    if (! u)
        Throw<std::runtime_error> (
            "Wrong field type");
    STExchange<U, T>::get(t, *u);
    return t;
}